

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprs.cpp
# Opt level: O2

CTcSymbol * __thiscall CTcSymLocalBase::new_ctx_var(CTcSymLocalBase *this)

{
  undefined1 *puVar1;
  int iVar2;
  CTcSymLocal *this_00;
  size_t in_RSI;
  
  this_00 = (CTcSymLocal *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x68,in_RSI);
  CTcSymLocal::CTcSymLocal
            (this_00,(this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.
                     super_CVmHashEntry.str_,
             (this->super_CTcSymbol).super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.
             len_,0,0,0);
  (this_00->super_CTcSymLocalBase).ctx_orig_ = (CTcSymLocal *)this;
  iVar2 = 1;
  if ((*(ushort *)&this->field_0x64 & 0x10) != 0) {
    iVar2 = this->ctx_level_ + 1;
  }
  puVar1 = &(this_00->super_CTcSymLocalBase).field_0x64;
  *(ushort *)puVar1 = *(ushort *)puVar1 | 0x10;
  (this_00->super_CTcSymLocalBase).ctx_level_ = iVar2;
  (this_00->super_CTcSymLocalBase).ctx_arr_idx_ = 0;
  return (CTcSymbol *)this_00;
}

Assistant:

CTcSymbol *CTcSymLocalBase::new_ctx_var() const
{
    /* create a new local with the same name */
    CTcSymLocal *lcl = new CTcSymLocal(
        get_sym(), get_sym_len(), FALSE, FALSE, 0);

    /* refer the copy back to the original (i.e., me) */
    lcl->set_ctx_orig((CTcSymLocal *)this);

    /* set up the context variable information */
    if (!is_ctx_local_)
    {
        /* 
         *   The original is a true local - we're at the first context
         *   level, and we don't yet have a property assigned, since we
         *   don't know if this variable is actually going to be
         *   referenced. 
         */
        lcl->set_ctx_level(1);
    }
    else
    {
        /* 
         *   The original was already a context variable - we're at one
         *   higher context level in this function, and we use the same
         *   context property as the original did.  
         */
        lcl->set_ctx_level(ctx_level_ + 1);
    }

    /* return the new symbol */
    return lcl;
}